

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void combine_process_op(gen_ctx_t gen_ctx,MIR_op_t *op_ref,bb_insn_t_conflict bb_insn)

{
  bb_insn_t_conflict bb_insn_local;
  MIR_op_t *op_ref_local;
  gen_ctx_t gen_ctx_local;
  
  if ((*(ushort *)&op_ref->field_0x8 & 0xff) == 2) {
    combine_process_var(gen_ctx,(op_ref->u).reg,bb_insn);
  }
  else if ((*(ushort *)&op_ref->field_0x8 & 0xff) == 0xb) {
    if ((op_ref->u).mem.base != 0xffffffff) {
      combine_process_var(gen_ctx,(op_ref->u).mem.base,bb_insn);
    }
    if ((op_ref->u).mem.index != 0xffffffff) {
      combine_process_var(gen_ctx,(op_ref->u).mem.index,bb_insn);
    }
  }
  return;
}

Assistant:

static void combine_process_op (gen_ctx_t gen_ctx, const MIR_op_t *op_ref, bb_insn_t bb_insn) {
  if (op_ref->mode == MIR_OP_VAR) {
    combine_process_var (gen_ctx, op_ref->u.var, bb_insn);
  } else if (op_ref->mode == MIR_OP_VAR_MEM) {
    if (op_ref->u.var_mem.base != MIR_NON_VAR)
      combine_process_var (gen_ctx, op_ref->u.var_mem.base, bb_insn);
    if (op_ref->u.var_mem.index != MIR_NON_VAR)
      combine_process_var (gen_ctx, op_ref->u.var_mem.index, bb_insn);
  }
}